

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakevfs.cpp
# Opt level: O0

int __thiscall QMakeVfs::idForFileName(QMakeVfs *this,QString *fn,VfsFlags flags)

{
  bool bVar1;
  int iVar2;
  QHash<int,_QString> *this_00;
  QString *this_01;
  QString *in_RSI;
  long in_FS_OFFSET;
  int *id;
  VfsFlag in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  QString *in_stack_ffffffffffffffc8;
  int local_14;
  QFlagsStorageHelper<QMakeVfs::VfsFlag,_4> local_10 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10[0].super_QFlagsStorage<QMakeVfs::VfsFlag>.i =
       (QFlagsStorage<QMakeVfs::VfsFlag>)
       QFlags<QMakeVfs::VfsFlag>::operator&
                 ((QFlags<QMakeVfs::VfsFlag> *)
                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffbc);
  bVar1 = QFlags<QMakeVfs::VfsFlag>::operator!((QFlags<QMakeVfs::VfsFlag> *)local_10);
  if (bVar1) {
    this_00 = (QHash<int,_QString> *)
              QHash<QString,_int>::operator[]
                        ((QHash<QString,_int> *)0xaaaaaaaaaaaaaaaa,in_stack_ffffffffffffffc8);
    if (*(int *)&this_00->d == 0) {
      iVar2 = QBasicAtomicInteger<int>::operator++((QBasicAtomicInteger<int> *)0x31b122);
      *(int *)&this_00->d = iVar2;
      this_01 = QHash<int,_QString>::operator[](this_00,(int *)in_RSI);
      QString::operator=(this_01,in_RSI);
    }
    local_14 = *(int *)&this_00->d;
  }
  else {
    local_14 = QHash<QString,_int>::value
                         ((QHash<QString,_int> *)in_stack_ffffffffffffffc8,
                          (QString *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_14;
  }
  __stack_chk_fail();
}

Assistant:

int QMakeVfs::idForFileName(const QString &fn, VfsFlags flags)
{
#ifdef PROEVALUATOR_DUAL_VFS
    {
# ifdef PROPARSER_THREAD_SAFE
        QMutexLocker locker(&m_vmutex);
# endif
        int idx = (flags & VfsCumulative) ? 1 : 0;
        if (flags & VfsCreate) {
            int &id = m_virtualFileIdMap[idx][fn];
            if (!id) {
                id = ++s_fileIdCounter;
                m_virtualIdFileMap[id] = fn;
            }
            return id;
        }
        int id = m_virtualFileIdMap[idx].value(fn);
        if (id || (flags & VfsCreatedOnly))
            return id;
    }
#endif
#ifdef PROPARSER_THREAD_SAFE
    QMutexLocker locker(&s_mutex);
#endif
    if (!(flags & VfsAccessedOnly)) {
        int &id = s_fileIdMap[fn];
        if (!id) {
            id = ++s_fileIdCounter;
            s_idFileMap[id] = fn;
        }
        return id;
    }
    return s_fileIdMap.value(fn);
}